

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_2::DeepScanLineOutputFile::writePixels(DeepScanLineOutputFile *this,int numScanLines)

{
  int *piVar1;
  Semaphore SVar2;
  pthread_mutex_t *__mutex;
  Data *pDVar3;
  pointer ppLVar4;
  LineBuffer *pLVar5;
  uint64_t packedDataSize;
  pointer ppLVar6;
  int iVar7;
  LineBufferTask *pLVar8;
  ulong uVar9;
  ArgExc *pAVar10;
  IoExc *this_00;
  int iVar11;
  size_t i;
  long lVar12;
  string *psVar13;
  int iVar14;
  string *psVar15;
  int scanLineMin;
  int number;
  bool bVar16;
  int local_1e8;
  int local_1e4;
  int local_1d4;
  int local_1c0;
  TaskGroup taskGroup;
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  std::mutex::lock((mutex *)&__mutex->__data);
  pDVar3 = this->_data;
  if ((pDVar3->slices).
      super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pDVar3->slices).
      super__Vector_base<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pAVar10 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar10,"No frame buffer specified as pixel data source.");
    __cxa_throw(pAVar10,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  iVar7 = (pDVar3->currentScanLine - pDVar3->minY) / pDVar3->linesInBuffer;
  IlmThread_3_2::TaskGroup::TaskGroup(&taskGroup);
  pDVar3 = this->_data;
  local_1c0 = pDVar3->currentScanLine;
  if (pDVar3->lineOrder == INCREASING_Y) {
    local_1d4 = numScanLines + local_1c0 + -1;
    local_1e4 = (local_1d4 - pDVar3->minY) / pDVar3->linesInBuffer;
    local_1e8 = (local_1e4 - iVar7) + 1;
    iVar11 = (int)((ulong)((long)(pDVar3->lineBuffers).
                                 super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pDVar3->lineBuffers).
                                super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
    if (iVar11 <= local_1e8) {
      local_1e8 = iVar11;
    }
    if (local_1e8 < 2) {
      local_1e8 = 1;
    }
    iVar11 = iVar7;
    iVar14 = local_1e8;
    while (bVar16 = iVar14 != 0, iVar14 = iVar14 + -1, bVar16) {
      pLVar8 = (LineBufferTask *)operator_new(0x20);
      anon_unknown_7::LineBufferTask::LineBufferTask
                (pLVar8,&taskGroup,this->_data,iVar11,local_1c0,local_1d4);
      IlmThread_3_2::ThreadPool::addGlobalTask((Task *)pLVar8);
      iVar11 = iVar11 + 1;
    }
    local_1e4 = local_1e4 + 1;
    iVar11 = 1;
  }
  else {
    local_1e4 = ((local_1c0 - (pDVar3->minY + numScanLines)) + 1) / pDVar3->linesInBuffer;
    scanLineMin = (local_1c0 - numScanLines) + 1;
    iVar11 = (iVar7 - local_1e4) + 1;
    iVar14 = (int)((ulong)((long)(pDVar3->lineBuffers).
                                 super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pDVar3->lineBuffers).
                                super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
    if (iVar14 <= iVar11) {
      iVar11 = iVar14;
    }
    number = iVar7;
    iVar14 = 1;
    local_1e8 = 1;
    if (1 < iVar11) {
      iVar14 = iVar11;
      local_1e8 = iVar11;
    }
    while (iVar14 != 0) {
      pLVar8 = (LineBufferTask *)operator_new(0x20);
      anon_unknown_7::LineBufferTask::LineBufferTask
                (pLVar8,&taskGroup,this->_data,number,scanLineMin,local_1c0);
      IlmThread_3_2::ThreadPool::addGlobalTask((Task *)pLVar8);
      number = number + -1;
      iVar14 = iVar14 + -1;
    }
    local_1e8 = -local_1e8;
    local_1e4 = local_1e4 + -1;
    iVar11 = -1;
    local_1d4 = local_1c0;
    local_1c0 = scanLineMin;
  }
  local_1e8 = iVar7 + local_1e8;
  uVar9 = (ulong)iVar7;
  while( true ) {
    iVar7 = iVar7 + iVar11;
    pDVar3 = this->_data;
    if (pDVar3->missingScanLines < 1) {
      pAVar10 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc
                (pAVar10,"Tried to write more scan lines than specified by the data window.");
      __cxa_throw(pAVar10,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
    }
    ppLVar4 = (pDVar3->lineBuffers).
              super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pLVar5 = ppLVar4[uVar9 % (ulong)((long)(pDVar3->lineBuffers).
                                           super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)ppLVar4 >> 3)];
    IlmThread_3_2::Semaphore::wait();
    iVar14 = (*(int *)((long)&(pLVar5->_tempCountBuffer)._sizeY + 4) -
             (int)(pLVar5->_tempCountBuffer)._sizeY) + 1;
    pDVar3 = this->_data;
    pDVar3->missingScanLines = pDVar3->missingScanLines - iVar14;
    SVar2 = pLVar5->_sem;
    if (SVar2 == (Semaphore)0x1) break;
    packedDataSize._0_4_ = pLVar5->format;
    packedDataSize._4_4_ = pLVar5->number;
    anon_unknown_7::writePixelData
              (pDVar3->_streamData,pDVar3,(int)(pLVar5->_tempCountBuffer)._sizeX,
               *(char **)&pLVar5->minY,packedDataSize,(uint64_t)pLVar5->compressor,
               (char *)(pLVar5->exception)._M_string_length,
               (pLVar5->exception).field_2._M_allocated_capacity);
    piVar1 = &this->_data->currentScanLine;
    *piVar1 = *piVar1 + iVar14 * iVar11;
    IlmThread_3_2::Semaphore::post();
    if (local_1e4 == iVar7) goto LAB_00167ce1;
    iVar14 = local_1e4;
    if (local_1e8 != local_1e4) {
      pLVar8 = (LineBufferTask *)operator_new(0x20);
      anon_unknown_7::LineBufferTask::LineBufferTask
                (pLVar8,&taskGroup,this->_data,local_1e8,local_1c0,local_1d4);
      IlmThread_3_2::ThreadPool::addGlobalTask((Task *)pLVar8);
      iVar14 = local_1e8 + iVar11;
    }
    uVar9 = uVar9 + (long)iVar11;
    local_1e8 = iVar14;
  }
  pDVar3->currentScanLine = pDVar3->currentScanLine + iVar14 * iVar11;
  IlmThread_3_2::Semaphore::post();
LAB_00167ce1:
  IlmThread_3_2::TaskGroup::~TaskGroup(&taskGroup);
  if (SVar2 == (Semaphore)0x0) {
    ppLVar4 = (this->_data->lineBuffers).
              super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppLVar6 = (this->_data->lineBuffers).
              super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    psVar13 = (string *)0x0;
    for (lVar12 = 0; (long)ppLVar6 - (long)ppLVar4 >> 3 != lVar12; lVar12 = lVar12 + 1) {
      pLVar5 = ppLVar4[lVar12];
      psVar15 = (string *)&pLVar5->field_0x80;
      if (psVar13 != (string *)0x0) {
        psVar15 = psVar13;
      }
      if (pLVar5->field_0x79 != '\0') {
        psVar13 = psVar15;
      }
      pLVar5->field_0x79 = 0;
    }
    if (psVar13 != (string *)0x0) {
      this_00 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::IoExc::IoExc(this_00,psVar13);
      __cxa_throw(this_00,&Iex_3_2::IoExc::typeinfo,Iex_3_2::IoExc::~IoExc);
    }
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void
DeepScanLineOutputFile::writePixels (int numScanLines)
{
    try
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
        if (_data->slices.size () == 0)
            throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
                                         "as pixel data source.");

        //
        // Maintain two iterators:
        //     nextWriteBuffer: next linebuffer to be written to the file
        //     nextCompressBuffer: next linebuffer to compress
        //

        int first =
            (_data->currentScanLine - _data->minY) / _data->linesInBuffer;

        int nextWriteBuffer = first;
        int nextCompressBuffer;
        int stop;
        int step;
        int scanLineMin;
        int scanLineMax;

        {
            //
            // Create a task group for all line buffer tasks. When the
            // taskgroup goes out of scope, the destructor waits until
            // all tasks are complete.
            //

            TaskGroup taskGroup;

            //
            // Determine the range of lineBuffers that intersect the scan
            // line range.  Then add the initial compression tasks to the
            // thread pool.  We always add in at least one task but the
            // individual task might not do anything if numScanLines == 0.
            //

            if (_data->lineOrder == INCREASING_Y)
            {
                int last = (_data->currentScanLine + (numScanLines - 1) -
                            _data->minY) /
                           _data->linesInBuffer;

                scanLineMin = _data->currentScanLine;
                scanLineMax = _data->currentScanLine + numScanLines - 1;

                int numTasks = max (
                    min ((int) _data->lineBuffers.size (), last - first + 1),
                    1);

                for (int i = 0; i < numTasks; i++)
                {
                    ThreadPool::addGlobalTask (new LineBufferTask (
                        &taskGroup,
                        _data,
                        first + i,
                        scanLineMin,
                        scanLineMax));
                }

                nextCompressBuffer = first + numTasks;
                stop               = last + 1;
                step               = 1;
            }
            else
            {
                int last = (_data->currentScanLine - (numScanLines - 1) -
                            _data->minY) /
                           _data->linesInBuffer;

                scanLineMax = _data->currentScanLine;
                scanLineMin = _data->currentScanLine - numScanLines + 1;

                int numTasks = max (
                    min ((int) _data->lineBuffers.size (), first - last + 1),
                    1);

                for (int i = 0; i < numTasks; i++)
                {
                    ThreadPool::addGlobalTask (new LineBufferTask (
                        &taskGroup,
                        _data,
                        first - i,
                        scanLineMin,
                        scanLineMax));
                }

                nextCompressBuffer = first - numTasks;
                stop               = last - 1;
                step               = -1;
            }

            while (true)
            {
                if (_data->missingScanLines <= 0)
                {
                    throw IEX_NAMESPACE::ArgExc (
                        "Tried to write more scan lines "
                        "than specified by the data window.");
                }

                //
                // Wait until the next line buffer is ready to be written
                //

                LineBuffer* writeBuffer =
                    _data->getLineBuffer (nextWriteBuffer);

                writeBuffer->wait ();

                int numLines =
                    writeBuffer->scanLineMax - writeBuffer->scanLineMin + 1;

                _data->missingScanLines -= numLines;

                //
                // If the line buffer is only partially full, then it is
                // not complete and we cannot write it to disk yet.
                //

                if (writeBuffer->partiallyFull)
                {
                    _data->currentScanLine =
                        _data->currentScanLine + step * numLines;
                    writeBuffer->post ();

                    return;
                }

                //
                // Write the line buffer
                //

                writePixelData (_data->_streamData, _data, writeBuffer);
                nextWriteBuffer += step;

                _data->currentScanLine =
                    _data->currentScanLine + step * numLines;

#ifdef DEBUG

                assert (
                    _data->currentScanLine ==
                    ((_data->lineOrder == INCREASING_Y)
                         ? writeBuffer->scanLineMax + 1
                         : writeBuffer->scanLineMin - 1));

#endif

                //
                // Release the lock on the line buffer
                //

                writeBuffer->post ();

                //
                // If this was the last line buffer in the scanline range
                //

                if (nextWriteBuffer == stop) break;

                //
                // If there are no more line buffers to compress,
                // then only continue to write out remaining lineBuffers
                //

                if (nextCompressBuffer == stop) continue;

                //
                // Add nextCompressBuffer as a compression task
                //

                ThreadPool::addGlobalTask (new LineBufferTask (
                    &taskGroup,
                    _data,
                    nextCompressBuffer,
                    scanLineMin,
                    scanLineMax));

                //
                // Update the next line buffer we need to compress
                //

                nextCompressBuffer += step;
            }

            //
            // Finish all tasks
            //
        }

        //
        // Exception handling:
        //
        // LineBufferTask::execute() may have encountered exceptions, but
        // those exceptions occurred in another thread, not in the thread
        // that is executing this call to OutputFile::writePixels().
        // LineBufferTask::execute() has caught all exceptions and stored
        // the exceptions' what() strings in the line buffers.
        // Now we check if any line buffer contains a stored exception; if
        // this is the case then we re-throw the exception in this thread.
        // (It is possible that multiple line buffers contain stored
        // exceptions.  We re-throw the first exception we find and
        // ignore all others.)
        //

        const string* exception = 0;

        for (size_t i = 0; i < _data->lineBuffers.size (); ++i)
        {
            LineBuffer* lineBuffer = _data->lineBuffers[i];

            if (lineBuffer->hasException && !exception)
                exception = &lineBuffer->exception;

            lineBuffer->hasException = false;
        }

        if (exception) throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Failed to write pixel data to image "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}